

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transition_table.cc
# Opt level: O0

void __thiscall
transition_table_make_table_from_transition_args_Test::TestBody
          (transition_table_make_table_from_transition_args_Test *this)

{
  anon_class_1_0_00000001 local_45;
  Event<(anonymous_namespace)::e3> local_44;
  anon_class_1_0_00000001 local_43;
  Event<(anonymous_namespace)::e3> local_42;
  identity<state_machine::transition::detail::empty> local_41;
  identity<state_machine::transition::detail::empty> local_40;
  identity<state_machine::transition::detail::empty> local_3f;
  identity<state_machine::transition::detail::empty> local_3e;
  Table<_3b221f19_> local_3d;
  transition_table_make_table_from_transition_args_Test *ptStack_38;
  Table<_3b221f19_> table;
  transition_table_make_table_from_transition_args_Test *this_local;
  
  ptStack_38 = this;
  state_machine::transition::
  make_table_from_transition_args<state_machine::transition::State<(anonymous_namespace)::s1>const&,state_machine::transition::Event<(anonymous_namespace)::e2>const&,state_machine::containers::basic::identity<state_machine::transition::detail::empty>const&,transition_table_make_table_from_transition_args_Test::TestBody()::__0,state_machine::transition::State<(anonymous_namespace)::s2>const&,state_machine::transition::State<(anonymous_namespace)::s1>const&,state_machine::transition::Event<(anonymous_namespace)::e1>const&,state_machine::containers::basic::identity<state_machine::transition::detail::empty>const&,transition_table_make_table_from_transition_args_Test::TestBody()::__1,state_machine::containers::basic::identity<state_machine::transition::detail::empty>const&,state_machine::transition::State<(anonymous_namespace)::s1>const&,state_machine::transition::Event<(anonymous_namespace)::e2>const&,state_machine::containers::basic::identity<state_machine::transition::detail::empty>const&,___sition_args_Test::TestBody()::__7,state_machine::transition::State<(anonymous_namespace)::s3>const&>
            (&local_3d,(transition *)&state_machine::state<(anonymous_namespace)::s1>,
             (State<(anonymous_namespace)::s1> *)&state_machine::event<(anonymous_namespace)::e2>,
             (Event<(anonymous_namespace)::e2> *)&state_machine::placeholder::_,&local_3e,
             (anon_class_1_0_00000001 *)&state_machine::state<(anonymous_namespace)::s2>,
             (State<(anonymous_namespace)::s2> *)&state_machine::state<(anonymous_namespace)::s1>,
             (State<(anonymous_namespace)::s1> *)&state_machine::event<(anonymous_namespace)::e1>,
             (Event<(anonymous_namespace)::e1> *)&state_machine::placeholder::_,&local_3f,
             (anon_class_1_0_00000001 *)&state_machine::placeholder::_,
             (identity<state_machine::transition::detail::empty> *)
             &state_machine::state<(anonymous_namespace)::s1>,
             (State<(anonymous_namespace)::s1> *)&state_machine::event<(anonymous_namespace)::e2>,
             (Event<(anonymous_namespace)::e2> *)&state_machine::placeholder::_,&local_40,
             (anon_class_1_0_00000001 *)&state_machine::state<(anonymous_namespace)::s3>,
             (State<(anonymous_namespace)::s3> *)&state_machine::state<(anonymous_namespace)::s1>,
             (State<(anonymous_namespace)::s1> *)&state_machine::event<(anonymous_namespace)::e3>,
             (Event<(anonymous_namespace)::e3> *)&state_machine::placeholder::_,&local_41,
             (anon_class_1_0_00000001 *)&state_machine::state<(anonymous_namespace)::s3>,
             (State<(anonymous_namespace)::s3> *)&state_machine::state<(anonymous_namespace)::s3>,
             (State<(anonymous_namespace)::s3> *)&state_machine::event<(anonymous_namespace)::e3>,
             &local_42,&local_43,
             (anon_class_1_0_00000001 *)&state_machine::state<(anonymous_namespace)::s2>,
             (State<(anonymous_namespace)::s2> *)&state_machine::state<(anonymous_namespace)::s3>,
             (State<(anonymous_namespace)::s3> *)&state_machine::event<(anonymous_namespace)::e3>,
             &local_44,&local_45,
             (anon_class_1_0_00000001 *)&state_machine::state<(anonymous_namespace)::s3>,
             (State<(anonymous_namespace)::s3> *)&state_machine::event<(anonymous_namespace)::e1>);
  return;
}

Assistant:

TEST(transition_table, make_table_from_transition_args) {
    // clang-format off
    auto table = make_table_from_transition_args(
        state<s1>, event<e2>,                                   _,                         [] { return s2{}; }, state<s2>,
        state<s1>, event<e1>,                                   _,                                       [] {},         _,
        state<s1>, event<e2>,                                   _,                        [] { return s3{3}; }, state<s3>,
        state<s1>, event<e3>,                                   _, [](auto e) noexcept { return s3{e.value}; }, state<s3>,
        state<s3>, event<e3>,  [](auto e) { return e.value > 0; },                         [] { return s2{}; }, state<s2>,
        state<s3>, event<e3>, [](auto e) { return e.value == 0; },                        [] { return s3{0}; }, state<s3>);
    static_assert(decltype(table)::size == 4, "");
    // clang-format on

    namespace tr = ::state_machine::transition;
    using FirstKey = std::decay_t<decltype(std::get<0>(table.data()))>::key_type;
    static_assert(std::is_same<FirstKey, tr::Key<tr::State<s1>, tr::Event<e2>>>::value, "");
}